

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zStream.c
# Opt level: O0

SRes LookToRead_Look_Lookahead(void *pp,void **buf,size_t *size)

{
  ulong *in_RDX;
  long *in_RSI;
  long in_RDI;
  size_t size2;
  CLookToRead *p;
  SRes res;
  ulong local_30;
  long local_28;
  SRes local_1c;
  ulong *local_18;
  long *local_10;
  
  local_1c = 0;
  local_30 = *(long *)(in_RDI + 0x30) - *(long *)(in_RDI + 0x28);
  local_28 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if ((local_30 == 0) && (*in_RDX != 0)) {
    *(undefined8 *)(in_RDI + 0x28) = 0;
    local_30 = 0x4000;
    local_1c = (*(code *)**(undefined8 **)(in_RDI + 0x20))
                         (*(undefined8 *)(in_RDI + 0x20),in_RDI + 0x38,&local_30);
    *(ulong *)(local_28 + 0x30) = local_30;
  }
  if (local_30 < *local_18) {
    *local_18 = local_30;
  }
  *local_10 = local_28 + 0x38 + *(long *)(local_28 + 0x28);
  return local_1c;
}

Assistant:

static SRes LookToRead_Look_Lookahead(void *pp, const void **buf, size_t *size)
{
  SRes res = SZ_OK;
  CLookToRead *p = (CLookToRead *)pp;
  size_t size2 = p->size - p->pos;
  if (size2 == 0 && *size > 0)
  {
    p->pos = 0;
    size2 = LookToRead_BUF_SIZE;
    res = p->realStream->Read(p->realStream, p->buf, &size2);
    p->size = size2;
  }
  if (size2 < *size)
    *size = size2;
  *buf = p->buf + p->pos;
  return res;
}